

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  ushort uVar1;
  sqlite3 *db;
  byte bVar2;
  int iVar3;
  SrcList *pTabList;
  Op *pOVar4;
  ulong uVar5;
  int iVar6;
  short *psVar7;
  long lVar8;
  ulong uVar9;
  Index *pIVar10;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int p1;
  Vdbe *in_stack_ffffffffffffffb0;
  Vdbe *p;
  
  db = pParse->db;
  p1 = pUpsert->iDataCur;
  if (p1 != iCur && pIdx != (Index *)0x0) {
    p = pParse->pVdbe;
    if ((pTab->tabFlags & 0x20) == 0) {
      if (pParse->nTempReg == '\0') {
        iVar6 = pParse->nMem + 1;
        pParse->nMem = iVar6;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar6 = pParse->aTempReg[bVar2];
      }
      in_stack_ffffffffffffffb0 = p;
      sqlite3VdbeAddOp3(p,0x88,iCur,iVar6,0);
      sqlite3VdbeAddOp3(p,0x1e,p1,0,iVar6);
      in_stack_ffffffffffffffac = p1;
      if (iVar6 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar6;
        }
      }
    }
    else {
      for (pIVar10 = pTab->pIndex;
          (pIVar10 != (Index *)0x0 && ((*(ushort *)&pIVar10->field_0x63 & 3) != 2));
          pIVar10 = pIVar10->pNext) {
      }
      uVar1 = pIVar10->nKeyCol;
      iVar6 = pParse->nMem + 1;
      in_stack_ffffffffffffffa8 = (uint)uVar1;
      pParse->nMem = pParse->nMem + in_stack_ffffffffffffffa8;
      if (uVar1 != 0) {
        uVar5 = (ulong)in_stack_ffffffffffffffa8;
        uVar9 = 0;
        do {
          iVar3 = -1;
          if (pIdx->nColumn != 0) {
            psVar7 = pIdx->aiColumn;
            lVar8 = 0;
            do {
              if (*psVar7 == pIVar10->aiColumn[uVar9]) {
                iVar3 = (int)lVar8 >> 0x10;
                break;
              }
              lVar8 = lVar8 + 0x10000;
              psVar7 = psVar7 + 1;
            } while ((ulong)pIdx->nColumn * 0x10000 != lVar8);
          }
          sqlite3VdbeAddOp3(p,0x5a,iCur,iVar3,(int)uVar9 + iVar6);
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar5);
      }
      in_stack_ffffffffffffffb0 = p;
      iVar6 = sqlite3VdbeAddOp3(p,0x1d,p1,0,iVar6);
      if (p->db->mallocFailed == '\0') {
        pOVar4 = p->aOp;
        pOVar4[iVar6].p4type = -3;
        pOVar4[iVar6].p4.i = in_stack_ffffffffffffffa8;
      }
      iVar3 = sqlite3VdbeAddOp3(p,0x45,0xb,2,0);
      sqlite3VdbeChangeP4(p,iVar3,"corrupt database",-1);
      if (p->db->mallocFailed == '\0') {
        iVar3 = p->nOp + -1;
        if (-1 < iVar6) {
          iVar3 = iVar6;
        }
        pOVar4 = p->aOp + iVar3;
      }
      else {
        pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar4->p2 = p->nOp;
      in_stack_ffffffffffffffac = p1;
    }
  }
  pTabList = sqlite3SrcListDup(db,pUpsert->pUpsertSrc,0);
  sqlite3Update(pParse,pTabList,pUpsert->pUpsertSet,pUpsert->pUpsertWhere,2,(ExprList *)pUpsert,
                (Expr *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                (Upsert *)in_stack_ffffffffffffffb0);
  pUpsert->pUpsertSet = (ExprList *)0x0;
  pUpsert->pUpsertWhere = (Expr *)0x0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;

  assert( v!=0 );
  assert( pUpsert!=0 );
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  iDataCur = pUpsert->iDataCur;
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      int i;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3ColumnOfIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0, 
            "corrupt database", P4_STATIC);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pUpsertSrc - the outer INSERT statement does.  So
  ** we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pUpsert->pUpsertSrc, 0);
  sqlite3Update(pParse, pSrc, pUpsert->pUpsertSet,
      pUpsert->pUpsertWhere, OE_Abort, 0, 0, pUpsert);
  pUpsert->pUpsertSet = 0;    /* Will have been deleted by sqlite3Update() */
  pUpsert->pUpsertWhere = 0;  /* Will have been deleted by sqlite3Update() */
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}